

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  Layer *pLVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  int iVar16;
  long lVar17;
  Option *opt_00;
  size_t totalsize;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  Mat bottom_blob_int8;
  Mat bottom_blob_g;
  Mat bottom_blob_int8_g;
  undefined1 local_a8 [36];
  undefined8 uStack_84;
  int iStack_7c;
  size_t local_78;
  Option opt_g;
  
  iVar1 = bottom_blob->c;
  iVar19 = (this->super_ConvolutionDepthWise).group;
  if (iVar1 % iVar19 != 0) {
    return -100;
  }
  if ((this->super_ConvolutionDepthWise).num_output % iVar19 != 0) {
    return -100;
  }
  iVar14 = bottom_blob->w;
  iVar19 = bottom_blob->h;
  opt_00 = (Option *)bottom_blob->elemsize;
  uVar13 = ((this->super_ConvolutionDepthWise).kernel_w + -1) *
           (this->super_ConvolutionDepthWise).dilation_w;
  uVar10 = ((this->super_ConvolutionDepthWise).kernel_h + -1) *
           (this->super_ConvolutionDepthWise).dilation_h;
  local_a8._0_8_ = bottom_blob->data;
  local_a8._8_8_ = bottom_blob->refcount;
  local_a8._24_8_ = bottom_blob->allocator;
  local_a8._32_4_ = bottom_blob->dims;
  if ((int *)local_a8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_a8._8_8_ = *(int *)local_a8._8_8_ + 1;
    UNLOCK();
  }
  uVar2 = bottom_blob->w;
  uVar4 = bottom_blob->h;
  uStack_84._4_4_ = uVar4;
  uStack_84._0_4_ = uVar2;
  iStack_7c = bottom_blob->c;
  local_78 = bottom_blob->cstep;
  local_a8._16_8_ = opt_00;
  if ((opt_00 != (Option *)0x1 & (this->super_ConvolutionDepthWise).use_int8_inference) == 1) {
    bottom_blob_int8.allocator = opt->workspace_allocator;
    auVar8._4_4_ = -(uint)(iVar19 == 0);
    auVar8._0_4_ = -(uint)(iVar14 == 0);
    auVar8._8_4_ = -(uint)(iVar1 == 0);
    auVar8._12_4_ = 0;
    movmskps((int)&bottom_blob_int8.dims,auVar8 << 0x20);
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.elemsize = 1;
    bottom_blob_int8.w = iVar14;
    bottom_blob_int8.dims = 3;
    bottom_blob_int8.h = iVar19;
    bottom_blob_int8.c = iVar1;
    bottom_blob_int8.cstep = (long)(iVar19 * iVar14) + 0xfU & 0xfffffffffffffff0;
    uVar18 = bottom_blob_int8.cstep * (long)iVar1;
    if (uVar18 != 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        pvVar12 = malloc(uVar18 + 0x1c);
        bottom_blob_int8.data = (void *)((long)pvVar12 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)bottom_blob_int8.data - 8) = pvVar12;
      }
      else {
        bottom_blob_int8.data =
             (void *)(*(code *)**(undefined8 **)bottom_blob_int8.allocator)
                               (bottom_blob_int8.allocator,uVar18 | 4);
      }
      bottom_blob_int8.refcount = (int *)((long)bottom_blob_int8.data + uVar18);
      *(undefined4 *)((long)bottom_blob_int8.data + uVar18) = 1;
    }
    if (bottom_blob_int8.data == (void *)0x0) {
      bVar22 = true;
    }
    else {
      bVar22 = (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    }
    if (bVar22) {
      if (bottom_blob_int8.refcount != (int *)0x0) {
        LOCK();
        *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
        UNLOCK();
        if (*bottom_blob_int8.refcount == 0) {
          if (bottom_blob_int8.allocator == (Allocator *)0x0) {
            if (bottom_blob_int8.data != (void *)0x0) {
              free(*(void **)((long)bottom_blob_int8.data + -8));
            }
          }
          else {
            (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
          }
        }
      }
      bottom_blob_int8.data = (void *)0x0;
      bottom_blob_int8.refcount = (int *)0x0;
      bottom_blob_int8.dims = 0;
      bottom_blob_int8.w = 0;
      bottom_blob_int8.h = 0;
      bottom_blob_int8.c = 0;
      iVar16 = -100;
      goto LAB_00126499;
    }
    iVar16 = (this->super_ConvolutionDepthWise).group;
    iVar11 = iVar1 / iVar16;
    if (0 < iVar16) {
      lVar20 = 0;
      lVar17 = 0;
      do {
        uVar5._0_1_ = opt->lightmode;
        uVar5._1_3_ = *(undefined3 *)&opt->field_0x1;
        uVar5._4_4_ = opt->num_threads;
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g._0_4_ = SUB84(uVar5,0);
        opt_g.num_threads = 1;
        opt_g.blob_allocator = bottom_blob_int8.allocator;
        bottom_blob_g.elemsize = bottom_blob->elemsize;
        bottom_blob_g.allocator = bottom_blob->allocator;
        bottom_blob_g.refcount = (int *)0x0;
        bottom_blob_g.data =
             (void *)(bottom_blob->cstep * lVar20 * bottom_blob_g.elemsize + (long)bottom_blob->data
                     );
        bottom_blob_g.w = bottom_blob->w;
        bottom_blob_g.dims = 3;
        bottom_blob_g.h = bottom_blob->h;
        bottom_blob_g.c = iVar11;
        bottom_blob_g.cstep =
             ((long)(bottom_blob->h * bottom_blob->w) * bottom_blob_g.elemsize + 0xf &
             0xfffffffffffffff0) / bottom_blob_g.elemsize;
        bottom_blob_int8_g.refcount = (int *)0x0;
        bottom_blob_int8_g.data =
             (void *)(bottom_blob_int8.cstep * lVar20 * bottom_blob_int8.elemsize +
                     (long)bottom_blob_int8.data);
        bottom_blob_int8_g.elemsize = bottom_blob_int8.elemsize;
        bottom_blob_int8_g.allocator = bottom_blob_int8.allocator;
        bottom_blob_int8_g.w = bottom_blob_int8.w;
        bottom_blob_int8_g.dims = 3;
        bottom_blob_int8_g.h = bottom_blob_int8.h;
        bottom_blob_int8_g.c = iVar11;
        bottom_blob_int8_g.cstep =
             ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * bottom_blob_int8.elemsize + 0xf &
             0xfffffffffffffff0) / bottom_blob_int8.elemsize;
        pLVar3 = (this->super_ConvolutionDepthWise).quantize_ops.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17];
        (*pLVar3->_vptr_Layer[5])(pLVar3,&bottom_blob_g,&bottom_blob_int8_g,&opt_g);
        if (bottom_blob_int8_g.refcount != (int *)0x0) {
          LOCK();
          *bottom_blob_int8_g.refcount = *bottom_blob_int8_g.refcount + -1;
          UNLOCK();
          if (*bottom_blob_int8_g.refcount == 0) {
            if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
              if (bottom_blob_int8_g.data != (void *)0x0) {
                free(*(void **)((long)bottom_blob_int8_g.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)bottom_blob_int8_g.allocator + 8))();
            }
          }
        }
        bottom_blob_int8_g.data = (void *)0x0;
        bottom_blob_int8_g.refcount = (int *)0x0;
        bottom_blob_int8_g.elemsize = 0;
        bottom_blob_int8_g.cstep = 0;
        bottom_blob_int8_g.dims = 0;
        bottom_blob_int8_g.w = 0;
        bottom_blob_int8_g.h = 0;
        bottom_blob_int8_g.c = 0;
        if (bottom_blob_g.refcount != (int *)0x0) {
          LOCK();
          *bottom_blob_g.refcount = *bottom_blob_g.refcount + -1;
          UNLOCK();
          if (*bottom_blob_g.refcount == 0) {
            if (bottom_blob_g.allocator == (Allocator *)0x0) {
              if (bottom_blob_g.data != (void *)0x0) {
                free(*(void **)((long)bottom_blob_g.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)bottom_blob_g.allocator + 8))();
            }
          }
        }
        bottom_blob_g.data = (void *)0x0;
        bottom_blob_g.refcount = (int *)0x0;
        bottom_blob_g.elemsize = 0;
        bottom_blob_g.cstep = 0;
        bottom_blob_g.dims = 0;
        bottom_blob_g.w = 0;
        bottom_blob_g.h = 0;
        bottom_blob_g.c = 0;
        lVar17 = lVar17 + 1;
        lVar20 = lVar20 + iVar11;
      } while (lVar17 < (this->super_ConvolutionDepthWise).group);
    }
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + 1;
      UNLOCK();
    }
    if ((int *)local_a8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_a8._8_8_ = *(int *)local_a8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_a8._8_8_ == 0) {
        if ((Allocator *)local_a8._24_8_ == (Allocator *)0x0) {
          if ((void *)local_a8._0_8_ != (void *)0x0) {
            free(*(void **)(local_a8._0_8_ + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_a8._24_8_ + 8))();
        }
      }
    }
    local_a8._0_8_ = bottom_blob_int8.data;
    local_a8._8_8_ = bottom_blob_int8.refcount;
    local_a8._16_8_ = bottom_blob_int8.elemsize;
    local_a8._24_8_ = bottom_blob_int8.allocator;
    local_a8._32_4_ = bottom_blob_int8.dims;
    uStack_84._0_4_ = bottom_blob_int8.w;
    uStack_84._4_4_ = bottom_blob_int8.h;
    iStack_7c = bottom_blob_int8.c;
    local_78 = bottom_blob_int8.cstep;
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
      UNLOCK();
      if (*bottom_blob_int8.refcount == 0) {
        if (bottom_blob_int8.allocator == (Allocator *)0x0) {
          if (bottom_blob_int8.data != (void *)0x0) {
            free(*(void **)((long)bottom_blob_int8.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
        }
      }
    }
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    iVar16 = -100;
    if (bVar22) goto LAB_00126499;
  }
  bottom_blob_int8.refcount = (int *)local_a8._8_8_;
  bottom_blob_int8.data = (void *)local_a8._0_8_;
  bottom_blob_int8.elemsize = local_a8._16_8_;
  bottom_blob_int8.allocator = (Allocator *)local_a8._24_8_;
  if ((int *)local_a8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_a8._8_8_ = *(int *)local_a8._8_8_ + 1;
    UNLOCK();
  }
  bottom_blob_int8.dims = local_a8._32_4_;
  bottom_blob_int8.w = (undefined4)uStack_84;
  bottom_blob_int8.h = uStack_84._4_4_;
  bottom_blob_int8.c = iStack_7c;
  bottom_blob_int8.cstep = local_78;
  iVar16 = (this->super_ConvolutionDepthWise).pad_w;
  if ((iVar16 < 1) && (iVar11 = (this->super_ConvolutionDepthWise).pad_h, iVar11 < 1)) {
    if (iVar11 == -0xe9 && iVar16 == -0xe9) {
      iVar11 = uVar13 - (iVar14 + -1) % (this->super_ConvolutionDepthWise).stride_w;
      iVar16 = uVar10 - (iVar19 + -1) % (this->super_ConvolutionDepthWise).stride_h;
      if ((iVar11 < 1) && (iVar16 < 1)) {
LAB_00125dc6:
        bVar22 = true;
        iVar19 = bottom_blob_int8.h;
        iVar14 = bottom_blob_int8.w;
      }
      else {
        copy_make_border((Mat *)local_a8,&bottom_blob_int8,iVar16 / 2,iVar16 - iVar16 / 2,iVar11 / 2
                         ,iVar11 - iVar11 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        if ((bottom_blob_int8.data != (void *)0x0) &&
           ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) goto LAB_00125dc6;
        bVar22 = false;
      }
      iVar16 = -100;
      if (!bVar22) goto LAB_00126444;
    }
LAB_00125c0a:
    Mat::create(top_blob,(int)(~uVar13 + iVar14) / (this->super_ConvolutionDepthWise).stride_w + 1,
                (int)(~uVar10 + iVar19) / (this->super_ConvolutionDepthWise).stride_h + 1,
                (this->super_ConvolutionDepthWise).num_output,(size_t)opt_00,opt->blob_allocator);
    iVar16 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar19 = (this->super_ConvolutionDepthWise).num_output;
      iVar14 = (this->super_ConvolutionDepthWise).group;
      if (iVar14 == iVar19 && iVar1 == iVar14) {
        auVar23._0_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3);
        auVar23._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3);
        auVar23._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
        auVar23._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
        uVar15 = movmskps(iVar19,auVar23);
        bVar9 = (byte)uVar15;
        bVar9 = bVar9 >> 1 & bVar9 & bVar9 >> 2 & (bVar9 & 8) >> 3;
        if ((this->super_ConvolutionDepthWise).use_int8_inference == true) {
          if (bVar9 == 0) {
LAB_0012621f:
            if ((this->super_ConvolutionDepthWise).group < 1) goto LAB_00126441;
            lVar17 = 0;
            do {
              bottom_blob_g.refcount = (int *)0x0;
              bottom_blob_g.data =
                   (void *)(bottom_blob_int8.cstep * lVar17 * bottom_blob_int8.elemsize +
                           (long)bottom_blob_int8.data);
              bottom_blob_g.elemsize = bottom_blob_int8.elemsize;
              bottom_blob_g.allocator = bottom_blob_int8.allocator;
              bottom_blob_g.w = bottom_blob_int8.w;
              bottom_blob_g.dims = 3;
              bottom_blob_g.h = bottom_blob_int8.h;
              bottom_blob_g.c = 1;
              bottom_blob_g.cstep =
                   ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * bottom_blob_int8.elemsize +
                    0xf & 0xfffffffffffffff0) / bottom_blob_int8.elemsize;
              bottom_blob_int8_g.elemsize = top_blob->elemsize;
              bottom_blob_int8_g.allocator = top_blob->allocator;
              bottom_blob_int8_g.refcount = (int *)0x0;
              bottom_blob_int8_g.data =
                   (void *)(top_blob->cstep * lVar17 * bottom_blob_int8_g.elemsize +
                           (long)top_blob->data);
              bottom_blob_int8_g.w = top_blob->w;
              bottom_blob_int8_g.dims = 3;
              bottom_blob_int8_g.h = top_blob->h;
              bottom_blob_int8_g.c = 1;
              bottom_blob_int8_g.cstep =
                   ((long)(top_blob->h * top_blob->w) * bottom_blob_int8_g.elemsize + 0xf &
                   0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
              pLVar3 = (this->group_ops).
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17];
              uVar7._0_1_ = opt->lightmode;
              uVar7._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar7._4_4_ = opt->num_threads;
              opt_g.workspace_allocator = opt->workspace_allocator;
              opt_g._0_4_ = SUB84(uVar7,0);
              opt_g.num_threads = 1;
              opt_g.blob_allocator = bottom_blob_int8_g.allocator;
              (*pLVar3->_vptr_Layer[5])(pLVar3,&bottom_blob_g,&bottom_blob_int8_g);
              if (bottom_blob_int8_g.refcount != (int *)0x0) {
                LOCK();
                *bottom_blob_int8_g.refcount = *bottom_blob_int8_g.refcount + -1;
                UNLOCK();
                if (*bottom_blob_int8_g.refcount == 0) {
                  if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                    if (bottom_blob_int8_g.data != (void *)0x0) {
                      free(*(void **)((long)bottom_blob_int8_g.data + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)bottom_blob_int8_g.allocator + 8))();
                  }
                }
              }
              bottom_blob_int8_g._0_16_ = ZEXT816(0);
              bottom_blob_int8_g.elemsize = 0;
              bottom_blob_int8_g.cstep = 0;
              bottom_blob_int8_g._32_16_ = ZEXT816(0);
              if (bottom_blob_g.refcount != (int *)0x0) {
                LOCK();
                *bottom_blob_g.refcount = *bottom_blob_g.refcount + -1;
                UNLOCK();
                if (*bottom_blob_g.refcount == 0) {
                  if (bottom_blob_g.allocator == (Allocator *)0x0) {
                    if (bottom_blob_g.data != (void *)0x0) {
                      free(*(void **)((long)bottom_blob_g.data + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)bottom_blob_g.allocator + 8))();
                  }
                }
              }
              bottom_blob_g._0_16_ = ZEXT816(0);
              iVar16 = 0;
              bottom_blob_g.elemsize = 0;
              bottom_blob_g.cstep = 0;
              bottom_blob_g._32_16_ = ZEXT816(0);
              lVar17 = lVar17 + 1;
            } while (lVar17 < (this->super_ConvolutionDepthWise).group);
          }
          else {
            uVar10 = (this->super_ConvolutionDepthWise).stride_w;
            uVar13 = (this->super_ConvolutionDepthWise).stride_h;
            if (uVar13 == 1 && uVar10 == 1) {
              convdw3x3s1_int8_sse
                        (&bottom_blob_int8,top_blob,&(this->super_ConvolutionDepthWise).weight_data,
                         (Option *)(ulong)uVar13);
            }
            else {
              uVar10 = uVar13 ^ 2 | uVar10 ^ 2;
              if (uVar10 != 0) goto LAB_0012621f;
              convdw3x3s2_int8_sse
                        (&bottom_blob_int8,top_blob,&(this->super_ConvolutionDepthWise).weight_data,
                         (Option *)(ulong)uVar10);
            }
            if ((this->super_ConvolutionDepthWise).group < 1) goto LAB_00126441;
            lVar17 = 0;
            do {
              uVar6._0_1_ = opt->lightmode;
              uVar6._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar6._4_4_ = opt->num_threads;
              bottom_blob_int8_g.elemsize = (size_t)opt->workspace_allocator;
              bottom_blob_int8_g.data._0_4_ = (undefined4)uVar6;
              bottom_blob_int8_g.data._4_4_ = 1;
              bottom_blob_g.allocator = top_blob->allocator;
              bottom_blob_int8_g.refcount = (int *)bottom_blob_g.allocator;
              bottom_blob_g.elemsize = top_blob->elemsize;
              bottom_blob_g.refcount = (int *)0x0;
              bottom_blob_g.data =
                   (void *)(top_blob->cstep * lVar17 * bottom_blob_g.elemsize + (long)top_blob->data
                           );
              bottom_blob_g.w = top_blob->w;
              bottom_blob_g.dims = 2;
              bottom_blob_g.h = top_blob->h;
              bottom_blob_g.c = 1;
              bottom_blob_g.cstep = (size_t)(top_blob->h * top_blob->w);
              pLVar3 = (this->super_ConvolutionDepthWise).dequantize_ops.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17];
              (*pLVar3->_vptr_Layer[7])(pLVar3,&bottom_blob_g,&bottom_blob_int8_g);
              if (bottom_blob_g.refcount != (int *)0x0) {
                LOCK();
                *bottom_blob_g.refcount = *bottom_blob_g.refcount + -1;
                UNLOCK();
                if (*bottom_blob_g.refcount == 0) {
                  if (bottom_blob_g.allocator == (Allocator *)0x0) {
                    if (bottom_blob_g.data != (void *)0x0) {
                      free(*(void **)((long)bottom_blob_g.data + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)bottom_blob_g.allocator + 8))();
                  }
                }
              }
              bottom_blob_g._0_16_ = ZEXT816(0);
              iVar16 = 0;
              bottom_blob_g.elemsize = 0;
              bottom_blob_g.cstep = 0;
              bottom_blob_g._32_16_ = ZEXT816(0);
              lVar17 = lVar17 + 1;
            } while (lVar17 < (this->super_ConvolutionDepthWise).group);
          }
        }
        else {
          if (bVar9 == 0) goto LAB_0012621f;
          iVar1 = (this->super_ConvolutionDepthWise).stride_w;
          iVar19 = (this->super_ConvolutionDepthWise).stride_h;
          if (iVar19 == 1 && iVar1 == 1) {
            convdw3x3s1_sse(&bottom_blob_int8,top_blob,
                            &(this->super_ConvolutionDepthWise).weight_data,
                            &(this->super_ConvolutionDepthWise).bias_data,opt_00);
          }
          else {
            if (iVar19 != 2 || iVar1 != 2) goto LAB_0012621f;
            convdw3x3s2_sse(&bottom_blob_int8,top_blob,
                            &(this->super_ConvolutionDepthWise).weight_data,
                            &(this->super_ConvolutionDepthWise).bias_data,opt_00);
          }
LAB_00126441:
          iVar16 = 0;
        }
      }
      else {
        if ((this->super_ConvolutionDepthWise).group < 1) goto LAB_00126441;
        lVar21 = 0;
        lVar20 = 0;
        lVar17 = 0;
        do {
          bottom_blob_g.refcount = (int *)0x0;
          bottom_blob_g.data =
               (void *)(bottom_blob_int8.cstep * lVar21 * bottom_blob_int8.elemsize +
                       (long)bottom_blob_int8.data);
          bottom_blob_g.elemsize = bottom_blob_int8.elemsize;
          bottom_blob_g.allocator = bottom_blob_int8.allocator;
          bottom_blob_g.w = bottom_blob_int8.w;
          bottom_blob_g.dims = 3;
          bottom_blob_g.h = bottom_blob_int8.h;
          bottom_blob_g.c = iVar1 / iVar14;
          bottom_blob_g.cstep =
               ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * bottom_blob_int8.elemsize + 0xf &
               0xfffffffffffffff0) / bottom_blob_int8.elemsize;
          bottom_blob_int8_g.elemsize = top_blob->elemsize;
          bottom_blob_int8_g.allocator = top_blob->allocator;
          bottom_blob_int8_g.refcount = (int *)0x0;
          bottom_blob_int8_g.data =
               (void *)(top_blob->cstep * lVar20 * bottom_blob_int8_g.elemsize +
                       (long)top_blob->data);
          bottom_blob_int8_g.w = top_blob->w;
          bottom_blob_int8_g.dims = 3;
          bottom_blob_int8_g.h = top_blob->h;
          bottom_blob_int8_g.c = iVar19 / iVar14;
          bottom_blob_int8_g.cstep =
               ((long)(top_blob->h * top_blob->w) * bottom_blob_int8_g.elemsize + 0xf &
               0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
          pLVar3 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17];
          opt_g.lightmode = opt->lightmode;
          opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.blob_allocator = bottom_blob_int8_g.allocator;
          (*pLVar3->_vptr_Layer[5])(pLVar3,&bottom_blob_g,&bottom_blob_int8_g);
          if (bottom_blob_int8_g.refcount != (int *)0x0) {
            LOCK();
            *bottom_blob_int8_g.refcount = *bottom_blob_int8_g.refcount + -1;
            UNLOCK();
            if (*bottom_blob_int8_g.refcount == 0) {
              if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                if (bottom_blob_int8_g.data != (void *)0x0) {
                  free(*(void **)((long)bottom_blob_int8_g.data + -8));
                }
              }
              else {
                (**(code **)(*(long *)bottom_blob_int8_g.allocator + 8))();
              }
            }
          }
          bottom_blob_int8_g._0_16_ = ZEXT816(0);
          bottom_blob_int8_g.elemsize = 0;
          bottom_blob_int8_g.cstep = 0;
          bottom_blob_int8_g._32_16_ = ZEXT816(0);
          if (bottom_blob_g.refcount != (int *)0x0) {
            LOCK();
            *bottom_blob_g.refcount = *bottom_blob_g.refcount + -1;
            UNLOCK();
            if (*bottom_blob_g.refcount == 0) {
              if (bottom_blob_g.allocator == (Allocator *)0x0) {
                if (bottom_blob_g.data != (void *)0x0) {
                  free(*(void **)((long)bottom_blob_g.data + -8));
                }
              }
              else {
                (**(code **)(*(long *)bottom_blob_g.allocator + 8))();
              }
            }
          }
          bottom_blob_g._0_16_ = ZEXT816(0);
          iVar16 = 0;
          bottom_blob_g.elemsize = 0;
          bottom_blob_g.cstep = 0;
          bottom_blob_g._32_16_ = ZEXT816(0);
          lVar17 = lVar17 + 1;
          lVar20 = lVar20 + iVar19 / iVar14;
          lVar21 = lVar21 + iVar1 / iVar14;
        } while (lVar17 < (this->super_ConvolutionDepthWise).group);
      }
    }
  }
  else {
    iVar19 = (this->super_ConvolutionDepthWise).pad_h;
    copy_make_border((Mat *)local_a8,&bottom_blob_int8,iVar19,iVar19,iVar16,iVar16,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    iVar16 = -100;
    if ((bottom_blob_int8.data != (void *)0x0) &&
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) {
      iVar19 = bottom_blob_int8.h;
      iVar14 = bottom_blob_int8.w;
      goto LAB_00125c0a;
    }
  }
LAB_00126444:
  if (bottom_blob_int8.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
    UNLOCK();
    if (*bottom_blob_int8.refcount == 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        if (bottom_blob_int8.data != (void *)0x0) {
          free(*(void **)((long)bottom_blob_int8.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
      }
    }
  }
  bottom_blob_int8._0_16_ = ZEXT816(0);
  bottom_blob_int8._32_16_ = ZEXT816(0);
LAB_00126499:
  bottom_blob_int8.cstep = 0;
  bottom_blob_int8.elemsize = 0;
  if ((int *)local_a8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_a8._8_8_ = *(int *)local_a8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_a8._8_8_ == 0) {
      if ((Allocator *)local_a8._24_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free(*(void **)(local_a8._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_a8._24_8_ + 8))();
      }
    }
  }
  return iVar16;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_inference)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                {
                    if (stride_w == 1 && stride_h == 1)
                    {
                        convdw3x3s1_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }
                    else if (stride_w == 2 && stride_h == 2)
                    {
                        convdw3x3s2_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }

                    // dequantize, reverse scale inplace
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int g=0; g<group; g++)
                    {
                        ncnn::Option opt_g = opt;
                        opt_g.num_threads = 1;
                        opt_g.blob_allocator = top_blob.allocator;

                        Mat top_blob_g = top_blob.channel(g);
                        dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                    }

                    return 0;
                }
            }
        }
        else
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if (stride_w == 1 && stride_h == 1)
                {
                    convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
                else if (stride_w == 2 && stride_h == 2)
                {
                    convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

            // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        ncnn::Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}